

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O1

bool __thiscall lddgraph::run(lddgraph *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  string dispcmd;
  string dotcmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  alreadyScanned;
  ofstream gvstream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  if (this->_quiet == true) {
    if (this->_verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Incompatible options -q and -V, please choose one.",0x32);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      return false;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Generating graph",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  if (this->_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing file ",0xd);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->_gvoutput)._M_dataplus._M_p,
                        (this->_gvoutput)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)(this->_gvoutput)._M_dataplus._M_p);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    if (this->_quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: Unable to open file ",0x1b);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->_gvoutput)._M_dataplus._M_p,
                          (this->_gvoutput)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    bVar4 = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"digraph Dependencies {",0x16);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = (this->_input)._M_dataplus._M_p;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar2,pcVar2 + (this->_input)._M_string_length);
    lddrecurse(this,&local_288,&local_268,(ofstream *)&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}",1);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::ostream::flush();
    std::ofstream::close();
    if ((this->_gvmode != true) || (bVar4 = true, this->_imgmode != false)) {
      if (this->_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Writing file ",0xd);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->_imgoutput)._M_dataplus._M_p,
                            (this->_imgoutput)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"dot ","");
      std::operator+(&local_250,"-T",&this->_imgformat);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_2f8 = *plVar7;
        lStack_2f0 = plVar6[3];
        local_308 = &local_2f8;
      }
      else {
        local_2f8 = *plVar7;
        local_308 = (long *)*plVar6;
      }
      local_300 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_308,(ulong)(this->_imgoutput)._M_dataplus._M_p);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_2d8 = *plVar7;
        lStack_2d0 = plVar6[3];
        local_2e8 = &local_2d8;
      }
      else {
        local_2d8 = *plVar7;
        local_2e8 = (long *)*plVar6;
      }
      local_2e0 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e8);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_2b8 = *plVar7;
        lStack_2b0 = plVar6[3];
        local_2c8 = &local_2b8;
      }
      else {
        local_2b8 = *plVar7;
        local_2c8 = (long *)*plVar6;
      }
      local_2c0 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2c8,(ulong)(this->_gvoutput)._M_dataplus._M_p);
      paVar1 = &local_328.field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_328.field_2._M_allocated_capacity = *psVar8;
        local_328.field_2._8_8_ = plVar6[3];
        local_328._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_328.field_2._M_allocated_capacity = *psVar8;
        local_328._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_328._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_2a8,(ulong)local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,local_2d8 + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      system((char *)local_2a8[0]);
      if (this->_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Deleting file ",0xe);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->_gvoutput)._M_dataplus._M_p,
                            (this->_gvoutput)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      if ((this->_gvmode != false) || (bVar4 = removefile(this,&this->_gvoutput), bVar4)) {
        bVar4 = true;
        if (this->_imgmode == false) {
          std::operator+(&local_328,"display ",&this->_imgoutput);
          system(local_328._M_dataplus._M_p);
          if (this->_verbose == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Deleting file ",0xe);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(this->_imgoutput)._M_dataplus._M_p,
                                (this->_imgoutput)._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          bVar4 = removefile(this,&this->_imgoutput);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar1) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        bVar4 = false;
      }
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0],local_298[0] + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return bVar4;
}

Assistant:

bool run()
    {
      if (_quiet && _verbose)
      {
        cerr << "Incompatible options -q and -V, please choose one." << endl;
        return false;
      }

      if (!_quiet)
        cout << "Generating graph" << endl;
      if (_verbose)
        cout << "Writing file " << _gvoutput << endl;
      ofstream gvstream;
      gvstream.open(_gvoutput.c_str());
      if (!gvstream.is_open())
      {
        if (!_quiet)
          cerr << "Error: Unable to open file " << _gvoutput << endl;
        return false;
      }

      gvstream << "digraph Dependencies {" << endl;

      /* Invokes ldd recursively */
      vector<string> alreadyScanned;
      lddrecurse(_input, alreadyScanned, gvstream);

      gvstream << "}" << endl;
      gvstream.flush();
      gvstream.close();

      /* Graphviz mode */
      if (_gvmode && !_imgmode)
        return true;

      /* Image file generation */
      if (_verbose)
        cout << "Writing file " << _imgoutput << endl;
      string dotcmd = "dot ";
      dotcmd += "-T" + _imgformat + " -o" + _imgoutput + " " + _gvoutput;
      system(dotcmd.c_str());

      /* Graphviz file cleanup */
      if (_verbose)
        cout << "Deleting file " << _gvoutput << endl;
      if (!_gvmode && !removefile(_gvoutput))
        return false;

      /* Image mode */
      if (_imgmode)
        return true;

      /* Image file display */
      string dispcmd = "display " + _imgoutput;
      system(dispcmd.c_str());

      /* Image file cleanup */
      if (_verbose)
        cout << "Deleting file " << _imgoutput << endl;
      return removefile(_imgoutput);
    }